

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QRectF * __thiscall QRectF::operator|(QRectF *this,QRectF *r)

{
  bool bVar1;
  double *pdVar2;
  QRectF *in_RDX;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal bottom;
  qreal top;
  qreal right;
  qreal left;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isNull(in_RSI);
  if (bVar1) {
    in_RDI->xp = in_RDX->xp;
    in_RDI->yp = in_RDX->yp;
    in_RDI->w = in_RDX->w;
    in_RDI->h = in_RDX->h;
  }
  else {
    bVar1 = isNull(in_RDX);
    if (bVar1) {
      in_RDI->xp = in_RSI->xp;
      in_RDI->yp = in_RSI->yp;
      in_RDI->w = in_RSI->w;
      in_RDI->h = in_RSI->h;
    }
    else {
      local_10 = in_RSI->xp;
      local_18 = in_RSI->xp;
      if (0.0 < in_RSI->w || in_RSI->w == 0.0) {
        local_18 = in_RSI->w + local_18;
      }
      else {
        local_10 = in_RSI->w + local_10;
      }
      if (0.0 < in_RDX->w || in_RDX->w == 0.0) {
        pdVar2 = qMin<double>(&local_10,&in_RDX->xp);
        local_10 = *pdVar2;
        local_28 = in_RDX->xp + in_RDX->w;
        pdVar2 = qMax<double>(&local_18,&local_28);
        local_18 = *pdVar2;
      }
      else {
        local_20 = in_RDX->xp + in_RDX->w;
        pdVar2 = qMin<double>(&local_10,&local_20);
        local_10 = *pdVar2;
        pdVar2 = qMax<double>(&local_18,&in_RDX->xp);
        local_18 = *pdVar2;
      }
      local_30 = in_RSI->yp;
      local_38 = in_RSI->yp;
      if (0.0 < in_RSI->h || in_RSI->h == 0.0) {
        local_38 = in_RSI->h + local_38;
      }
      else {
        local_30 = in_RSI->h + local_30;
      }
      if (0.0 < in_RDX->h || in_RDX->h == 0.0) {
        pdVar2 = qMin<double>(&local_30,&in_RDX->yp);
        local_30 = *pdVar2;
        local_48 = in_RDX->yp + in_RDX->h;
        pdVar2 = qMax<double>(&local_38,&local_48);
        local_38 = *pdVar2;
      }
      else {
        local_40 = in_RDX->yp + in_RDX->h;
        pdVar2 = qMin<double>(&local_30,&local_40);
        local_30 = *pdVar2;
        pdVar2 = qMax<double>(&local_38,&in_RDX->yp);
        local_38 = *pdVar2;
      }
      QRectF(in_RDI,local_10,local_30,local_18 - local_10,local_38 - local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QRectF::operator|(const QRectF &r) const noexcept
{
    if (isNull())
        return r;
    if (r.isNull())
        return *this;

    qreal left = xp;
    qreal right = xp;
    if (w < 0)
        left += w;
    else
        right += w;

    if (r.w < 0) {
        left = qMin(left, r.xp + r.w);
        right = qMax(right, r.xp);
    } else {
        left = qMin(left, r.xp);
        right = qMax(right, r.xp + r.w);
    }

    qreal top = yp;
    qreal bottom = yp;
    if (h < 0)
        top += h;
    else
        bottom += h;

    if (r.h < 0) {
        top = qMin(top, r.yp + r.h);
        bottom = qMax(bottom, r.yp);
    } else {
        top = qMin(top, r.yp);
        bottom = qMax(bottom, r.yp + r.h);
    }

    return QRectF(left, top, right - left, bottom - top);
}